

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_serialization.hpp
# Opt level: O0

void duckdb::FunctionSerializer::Serialize<duckdb::TableFunction>
               (Serializer *serializer,TableFunction *function,
               optional_ptr<duckdb::FunctionData,_true> bind_info)

{
  anon_class_16_2_9281c563 f;
  TableFunction *in_RSI;
  optional_ptr<duckdb::FunctionData,_true> *in_RDI;
  byte bVar1;
  bool has_serialize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  field_id_t field_id;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined1 local_8 [8];
  
  field_id = (field_id_t)((ulong)in_stack_ffffffffffffffd8 >> 0x30);
  Serializer::WriteProperty<std::__cxx11::string>
            ((Serializer *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),field_id,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  Serializer::WriteProperty<duckdb::vector<duckdb::LogicalType,true>>
            ((Serializer *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),field_id,
             in_stack_ffffffffffffffd0,
             (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffffc8);
  Serializer::WriteProperty<duckdb::vector<duckdb::LogicalType,true>>
            ((Serializer *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),field_id,
             in_stack_ffffffffffffffd0,
             (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffffc8);
  bVar1 = in_RSI->serialize != (table_function_serialize_t)0x0;
  Serializer::WriteProperty<bool>
            ((Serializer *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),field_id,
             in_stack_ffffffffffffffd0,(bool *)in_stack_ffffffffffffffc8);
  if ((bVar1 & 1) != 0) {
    f.bind_info = in_RDI;
    f.function = in_RSI;
    Serializer::
    WriteObject<duckdb::FunctionSerializer::Serialize<duckdb::TableFunction>(duckdb::Serializer&,duckdb::TableFunction_const&,duckdb::optional_ptr<duckdb::FunctionData,true>)::_lambda(duckdb::Serializer&)_1_>
              ((Serializer *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
               (field_id_t)((ulong)local_8 >> 0x30),(char *)in_RSI,f);
  }
  return;
}

Assistant:

static void Serialize(Serializer &serializer, const FUNC &function, optional_ptr<FunctionData> bind_info) {
		D_ASSERT(!function.name.empty());
		serializer.WriteProperty(500, "name", function.name);
		serializer.WriteProperty(501, "arguments", function.arguments);
		serializer.WriteProperty(502, "original_arguments", function.original_arguments);
		bool has_serialize = function.serialize;
		serializer.WriteProperty(503, "has_serialize", has_serialize);
		if (has_serialize) {
			serializer.WriteObject(504, "function_data",
			                       [&](Serializer &obj) { function.serialize(obj, bind_info, function); });
			D_ASSERT(function.deserialize);
		}
	}